

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O0

Result RunAllExports(Ptr *instance,Errors *errors)

{
  Stream *this;
  bool bVar1;
  Instance *pIVar2;
  Ref ref;
  Module *this_00;
  ModuleDesc *pMVar3;
  reference str;
  pointer pEVar4;
  undefined8 uVar5;
  RefVec *this_01;
  const_reference pvVar6;
  Func *this_02;
  pointer trap_00;
  string_view name;
  string_view local_f0;
  Enum local_dc;
  undefined1 local_d8 [8];
  Ptr trap;
  Values results;
  Values params;
  undefined1 local_88 [8];
  RefPtr<wabt::interp::Func> func;
  FuncType *func_type;
  ExportDesc *export_;
  const_iterator __end1;
  const_iterator __begin1;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> *__range1;
  ModuleDesc *module_desc;
  undefined1 local_38 [8];
  RefPtr<wabt::interp::Module> module;
  Errors *errors_local;
  Ptr *instance_local;
  Result result;
  
  module.root_index_ = (Index)errors;
  wabt::Result::Result((Result *)((long)&instance_local + 4),Ok);
  pIVar2 = wabt::interp::RefPtr<wabt::interp::Instance>::operator->(instance);
  ref = wabt::interp::Instance::module(pIVar2);
  wabt::interp::Store::UnsafeGet<wabt::interp::Module>
            ((RefPtr<wabt::interp::Module> *)local_38,&s_store,ref);
  this_00 = wabt::interp::RefPtr<wabt::interp::Module>::operator->
                      ((RefPtr<wabt::interp::Module> *)local_38);
  pMVar3 = wabt::interp::Module::desc(this_00);
  __end1 = std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::begin
                     (&pMVar3->exports);
  export_ = (ExportDesc *)
            std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::end
                      (&pMVar3->exports);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                                     *)&export_), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
          ::operator*(&__end1);
    pEVar4 = std::
             unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
             operator->(&(str->type).type);
    if (pEVar4->kind == First) {
      pEVar4 = std::
               unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
               ::get(&(str->type).type);
      func.root_index_ = (Index)wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>(pEVar4);
      bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty
                        (&((FuncType *)func.root_index_)->params);
      this = s_trace_stream;
      if (bVar1) {
        if (s_trace_stream != (Stream *)0x0) {
          uVar5 = std::__cxx11::string::c_str();
          wabt::Stream::Writef(this,">>> running export \"%s\":\n",uVar5);
        }
        pIVar2 = wabt::interp::RefPtr<wabt::interp::Instance>::operator->(instance);
        this_01 = wabt::interp::Instance::funcs(pIVar2);
        pvVar6 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                           (this_01,(ulong)str->index);
        wabt::interp::Store::UnsafeGet<wabt::interp::Func>
                  ((RefPtr<wabt::interp::Func> *)local_88,&s_store,(Ref)pvVar6->index);
        std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                  ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                   &results.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                  ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                   &trap.root_index_);
        wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_d8);
        this_02 = wabt::interp::RefPtr<wabt::interp::Func>::operator->
                            ((RefPtr<wabt::interp::Func> *)local_88);
        local_dc = (Enum)wabt::interp::Func::Call
                                   (this_02,&s_store,
                                    (Values *)
                                    &results.
                                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (Values *)&trap.root_index_,(Ptr *)local_d8,s_trace_stream);
        wabt::Result::operator|=((Result *)((long)&instance_local + 4),(Result)local_dc);
        trap_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                            (&s_stdout_stream);
        wabt::string_view::string_view(&local_f0,(string *)str);
        name.size_ = func.root_index_;
        name.data_ = (char *)local_f0.size_;
        wabt::interp::WriteCall
                  ((interp *)trap_00,(Stream *)local_f0.data_,name,
                   (FuncType *)
                   &results.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(Values *)&trap.root_index_,
                   (Values *)local_d8,(Ptr *)trap_00);
        wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_d8);
        std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
                  ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                   &trap.root_index_);
        std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
                  ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                   &results.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        wabt::interp::RefPtr<wabt::interp::Func>::~RefPtr((RefPtr<wabt::interp::Func> *)local_88);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
    ::operator++(&__end1);
  }
  wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_38);
  return (Result)instance_local._4_4_;
}

Assistant:

Result RunAllExports(const Instance::Ptr& instance, Errors* errors) {
  Result result = Result::Ok;

  auto module = s_store.UnsafeGet<Module>(instance->module());
  auto&& module_desc = module->desc();

  for (auto&& export_ : module_desc.exports) {
    if (export_.type.type->kind != ExternalKind::Func) {
      continue;
    }
    auto* func_type = cast<FuncType>(export_.type.type.get());
    if (func_type->params.empty()) {
      if (s_trace_stream) {
        s_trace_stream->Writef(">>> running export \"%s\":\n",
                               export_.type.name.c_str());
      }
      auto func = s_store.UnsafeGet<Func>(instance->funcs()[export_.index]);
      Values params;
      Values results;
      Trap::Ptr trap;
      result |= func->Call(s_store, params, results, &trap, s_trace_stream);
      WriteCall(s_stdout_stream.get(), export_.type.name, *func_type, params,
                results, trap);
    }
  }

  return result;
}